

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O1

void __thiscall wirehair::Codec::SetInput(Codec *this,void *message_in)

{
  if ((this->_input_allocated != 0) && (this->_input_blocks != (uint8_t *)0x0)) {
    SIMDSafeFree(this->_input_blocks);
    this->_input_blocks = (uint8_t *)0x0;
  }
  this->_input_allocated = 0;
  this->_input_blocks = (uint8_t *)message_in;
  return;
}

Assistant:

void Codec::SetInput(const void * GF256_RESTRICT message_in)
{
    FreeInput();

    // Set input blocks to the input message
    _input_blocks = (uint8_t*)message_in;
    _input_allocated = 0;
}